

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O3

void flatview_add_to_dispatch_aarch64
               (uc_struct_conflict2 *uc,FlatView *fv,MemoryRegionSection *section)

{
  uint uVar1;
  uint64_t nb;
  uint16_t leaf;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t r_2;
  ulong uVar7;
  ulong uVar8;
  uint64_t r;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  MemoryRegionSection remain;
  MemoryRegionSection now;
  MemoryRegionSection local_c8;
  AddressSpaceDispatch *local_80;
  MemoryRegionSection local_78;
  
  uVar3 = (ulong)section->size;
  uVar11 = *(ulong *)((long)&section->size + 8);
  local_c8.mr = section->mr;
  local_c8.fv = section->fv;
  local_c8.offset_within_region = section->offset_within_region;
  uVar4 = section->offset_within_address_space;
  local_c8.readonly = section->readonly;
  local_c8._49_7_ = *(undefined7 *)&section->field_0x31;
  local_c8._56_8_ = *(undefined8 *)&section->field_0x38;
  uVar8 = uc->init_target_page->mask;
  uVar7 = (ulong)-(int)uVar8;
  if ((uVar4 & ~uVar8) != 0) {
    uVar9 = (-uVar7 & (uVar7 - 1) + uVar4) - uVar4;
    uVar8 = (ulong)section->size;
    uVar10 = *(ulong *)((long)&section->size + 8);
    local_78.mr = section->mr;
    local_78.fv = section->fv;
    local_78.offset_within_region = section->offset_within_region;
    local_78.offset_within_address_space = section->offset_within_address_space;
    local_78.readonly = section->readonly;
    local_78._49_7_ = *(undefined7 *)&section->field_0x31;
    local_78._56_8_ = *(undefined8 *)&section->field_0x38;
    if ((long)-uVar10 < (long)(ulong)(uVar9 < uVar8)) {
      uVar10 = 0;
      uVar8 = uVar9;
    }
    local_c8.size._0_8_ = uVar3;
    local_c8.size._8_8_ = uVar11;
    local_c8.offset_within_address_space = uVar4;
    local_78.size._0_8_ = uVar8;
    local_78.size._8_8_ = uVar10;
    register_subpage(uc,fv,&local_78);
    if (local_c8.size._8_8_ == uVar10 && (ulong)local_c8.size == uVar8) {
      return;
    }
    uVar3 = (ulong)local_c8.size - uVar8;
    uVar11 = (local_c8.size._8_8_ - uVar10) - (ulong)((ulong)local_c8.size < uVar8);
    local_c8.size._0_8_ = uVar3;
    local_c8.size._8_8_ = uVar11;
    if (uVar10 != 0) goto LAB_005d7a6d;
    uVar4 = uVar4 + uVar8;
    local_c8.offset_within_region = local_c8.offset_within_region + uVar8;
  }
  local_c8.size._0_8_ = uVar3;
  local_c8.size._8_8_ = uVar11;
  local_c8.offset_within_address_space = uVar4;
  if ((long)uVar11 < (long)(ulong)(uVar3 < uVar7)) {
LAB_005d7a4e:
    register_subpage(uc,fv,&local_c8);
    return;
  }
  local_78.readonly = local_c8.readonly;
  local_78._49_7_ = local_c8._49_7_;
  local_78._56_8_ = local_c8._56_8_;
  local_78.offset_within_region = local_c8.offset_within_region;
  uVar10 = -(ulong)(uVar7 != 0) & uVar11;
  uVar8 = -uVar7 & uVar3;
  local_78.mr = local_c8.mr;
  local_78.fv = local_c8.fv;
  local_80 = fv->dispatch;
  local_78.size._0_8_ = uVar8;
  local_78.size._8_8_ = uVar10;
  local_78.offset_within_address_space = uVar4;
  leaf = phys_section_add((uc_struct_conflict2 *)uc->init_target_page->mask,&local_80->map,&local_78
                         );
  uVar1 = uc->init_target_page->bits;
  bVar2 = (byte)uVar1;
  uVar5 = (long)uVar10 >> (bVar2 & 0x3f);
  uVar6 = uVar5;
  nb = uVar8 >> (bVar2 & 0x3f) | uVar10 << 0x40 - (bVar2 & 0x3f);
  if ((uVar1 & 0x40) != 0) {
    uVar6 = (long)uVar10 >> 0x3f;
    nb = uVar5;
  }
  if (uVar6 == 0) {
    if (nb == 0) {
      __assert_fail("num_pages",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x38d,
                    "void register_multipage(struct uc_struct *, FlatView *, MemoryRegionSection *)"
                   );
    }
    phys_page_set(local_80,uVar4 >> (bVar2 & 0x3f),nb,leaf);
    if (uVar11 == uVar10 && uVar3 == uVar8) {
      return;
    }
    local_c8.size._0_8_ = uVar3 - uVar8;
    local_c8.size._8_8_ = (uVar11 - uVar10) - (ulong)(uVar3 < uVar8);
    if (uVar10 == 0) {
      local_c8.offset_within_address_space = uVar4 + uVar8;
      local_c8.offset_within_region = local_c8.offset_within_region + uVar8;
      goto LAB_005d7a4e;
    }
  }
LAB_005d7a6d:
  __assert_fail("r == a",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                ,0x16,"uint64_t int128_get64(Int128)");
}

Assistant:

void flatview_add_to_dispatch(struct uc_struct *uc, FlatView *fv, MemoryRegionSection *section)
{
    MemoryRegionSection remain = *section;
    Int128 page_size = int128_make64(TARGET_PAGE_SIZE);

    /* register first subpage */
    if (remain.offset_within_address_space & ~TARGET_PAGE_MASK) {
        uint64_t left = TARGET_PAGE_ALIGN(remain.offset_within_address_space)
                        - remain.offset_within_address_space;

        MemoryRegionSection now = remain;
        now.size = int128_min(int128_make64(left), now.size);
        register_subpage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register whole pages */
    if (int128_ge(remain.size, page_size)) {
        MemoryRegionSection now = remain;
        now.size = int128_and(now.size, int128_neg(page_size));
        register_multipage(uc, fv, &now);
        if (int128_eq(remain.size, now.size)) {
            return;
        }
        remain.size = int128_sub(remain.size, now.size);
        remain.offset_within_address_space += int128_get64(now.size);
        remain.offset_within_region += int128_get64(now.size);
    }

    /* register last subpage */
    register_subpage(uc, fv, &remain);
}